

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gens_opn2.cpp
# Opt level: O2

void __thiscall GensOPN2::nativeGenerateN(GensOPN2 *this,int16_t *output,size_t frames)

{
  Ym2612 *this_00;
  ulong uVar1;
  int32_t *piVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  int32_t bufLR [512];
  
  if (frames < 0x101) {
    this_00 = this->chip;
    memset(bufLR,0,0x800);
    LibGens::Ym2612::resetBufferPtrs(this_00,bufLR,bufLR + 0x100);
    this_00->m_writeLen = this_00->m_writeLen + (int)frames;
    LibGens::Ym2612::specialUpdate(this_00);
    for (uVar4 = 0; frames * 2 != uVar4; uVar4 = uVar4 + 1) {
      piVar2 = bufLR + 0x100;
      if ((uVar4 & 1) == 0) {
        piVar2 = bufLR;
      }
      uVar1 = (long)*(int *)((long)piVar2 + (uVar4 & 0xfffffffffffffffe) * 2) / 4;
      uVar3 = uVar1 & 0xffffffff;
      if ((int)uVar1 < -0x7fff) {
        uVar3 = 0xffff8000;
      }
      if (0x7ffe < (int)uVar3) {
        uVar3 = 0x7fff;
      }
      output[uVar4] = (int16_t)uVar3;
    }
    return;
  }
  __assert_fail("frames <= maxFrames",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens_opn2.cpp"
                ,0x54,"virtual void GensOPN2::nativeGenerateN(int16_t *, size_t)");
}

Assistant:

void GensOPN2::nativeGenerateN(int16_t *output, size_t frames)
{
    enum { maxFrames = 256 };
    assert(frames <= maxFrames);

    LibGens::Ym2612 *chip = this->chip;
    int32_t bufLR[2 * maxFrames] = {};
    int32_t *bufL = &bufLR[0];
    int32_t *bufR = &bufLR[maxFrames];

    chip->resetBufferPtrs(bufL, bufR);
    chip->addWriteLen((int)frames);
    chip->specialUpdate();

    //TODO
    // chip->updateDacAndTimers(bufL, bufR, frames);

    for (size_t i = 0; i < 2 * frames; ++i)
    {
        int32_t sample = ((i & 1) ? bufR : bufL)[i / 2];
        sample /= 4; // has too high volume, attenuation needed
        sample = (sample < INT16_MIN) ? INT16_MIN : sample;
        sample = (sample > INT16_MAX) ? INT16_MAX : sample;
        output[i] = (int16_t)sample;
    }
}